

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net.cpp
# Opt level: O0

RPCHelpMan * setnetworkactive(void)

{
  initializer_list<RPCArg> __l;
  RPCHelpMan *in_RDI;
  undefined1 *puVar1;
  long in_FS_OFFSET;
  allocator<RPCArg> *in_stack_fffffffffffffb38;
  RPCArg *this;
  anon_class_1_0_00000001 *in_stack_fffffffffffffb40;
  function<UniValue_(const_RPCHelpMan_&,_const_JSONRPCRequest_&)> *in_stack_fffffffffffffb48;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffb50;
  allocator_type *in_stack_fffffffffffffb70;
  allocator<char> *in_stack_fffffffffffffb78;
  iterator in_stack_fffffffffffffb80;
  undefined1 *puVar2;
  RPCArgOptions *in_stack_fffffffffffffb88;
  string *in_stack_fffffffffffffb90;
  Fallback *in_stack_fffffffffffffb98;
  undefined1 skip_type_check;
  undefined8 in_stack_fffffffffffffba0;
  Type type;
  vector<RPCResult,_std::allocator<RPCResult>_> *inner;
  string *in_stack_fffffffffffffba8;
  string *description;
  RPCArg *in_stack_fffffffffffffbb0;
  RPCResult *result;
  RPCResults *this_00;
  RPCResult *this_01;
  allocator<char> local_3a9;
  vector<RPCResult,_std::allocator<RPCResult>_> local_3a8;
  allocator<char> local_38a;
  allocator<char> local_389 [9];
  undefined8 in_stack_fffffffffffffc80;
  undefined8 in_stack_fffffffffffffc88;
  undefined8 in_stack_fffffffffffffc90;
  undefined4 uVar3;
  undefined4 in_stack_fffffffffffffc9c;
  undefined8 in_stack_fffffffffffffca0;
  undefined8 in_stack_fffffffffffffca8;
  allocator<char> local_342;
  allocator<char> local_341 [225];
  RPCMethodImpl *in_stack_fffffffffffffda0;
  undefined1 local_150 [264];
  undefined1 local_48 [64];
  long local_8;
  
  type = (Type)((ulong)in_stack_fffffffffffffba0 >> 0x20);
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffffb88,(char *)in_stack_fffffffffffffb80,in_stack_fffffffffffffb78);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffffb88,(char *)in_stack_fffffffffffffb80,in_stack_fffffffffffffb78);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffffb88,(char *)in_stack_fffffffffffffb80,in_stack_fffffffffffffb78);
  uVar3 = 0;
  std::variant<RPCArg::Optional,std::__cxx11::string,UniValue>::
  variant<RPCArg::Optional,void,void,RPCArg::Optional,void>
            ((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)in_stack_fffffffffffffb48,(Optional *)in_stack_fffffffffffffb40);
  this_01 = (RPCResult *)&stack0xfffffffffffffc97;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffffb88,(char *)in_stack_fffffffffffffb80,in_stack_fffffffffffffb78);
  std::__cxx11::string::string(in_stack_fffffffffffffb50);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)in_stack_fffffffffffffb38);
  RPCArg::RPCArg(in_stack_fffffffffffffbb0,in_stack_fffffffffffffba8,type,in_stack_fffffffffffffb98,
                 in_stack_fffffffffffffb90,in_stack_fffffffffffffb88);
  skip_type_check = (undefined1)((ulong)in_stack_fffffffffffffb98 >> 0x38);
  this_00 = (RPCResults *)&stack0xfffffffffffffc96;
  std::allocator<RPCArg>::allocator(in_stack_fffffffffffffb38);
  __l._M_len = (size_type)in_stack_fffffffffffffb88;
  __l._M_array = in_stack_fffffffffffffb80;
  std::vector<RPCArg,_std::allocator<RPCArg>_>::vector
            ((vector<RPCArg,_std::allocator<RPCArg>_> *)in_stack_fffffffffffffb78,__l,
             in_stack_fffffffffffffb70);
  result = (RPCResult *)local_389;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffffb88,(char *)in_stack_fffffffffffffb80,in_stack_fffffffffffffb78);
  description = (string *)&local_38a;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffffb88,(char *)in_stack_fffffffffffffb80,in_stack_fffffffffffffb78);
  local_3a8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_3a8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_3a8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  inner = &local_3a8;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_fffffffffffffb38);
  RPCResult::RPCResult
            (this_01,(Type)((ulong)this_00 >> 0x20),(string *)result,description,inner,
             (bool)skip_type_check);
  RPCResults::RPCResults(this_00,result);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffffb88,(char *)in_stack_fffffffffffffb80,in_stack_fffffffffffffb78);
  RPCExamples::RPCExamples((RPCExamples *)in_stack_fffffffffffffb38,(string *)0x1357e00);
  this = (RPCArg *)&stack0xfffffffffffffc30;
  std::function<UniValue(RPCHelpMan_const&,JSONRPCRequest_const&)>::
  function<setnetworkactive()::__0,void>(in_stack_fffffffffffffb48,in_stack_fffffffffffffb40);
  RPCHelpMan::RPCHelpMan
            ((RPCHelpMan *)in_stack_fffffffffffffca8,(string *)in_stack_fffffffffffffca0,
             (string *)CONCAT44(in_stack_fffffffffffffc9c,uVar3),
             (vector<RPCArg,_std::allocator<RPCArg>_> *)in_stack_fffffffffffffc90,
             (RPCResults *)in_stack_fffffffffffffc88,(RPCExamples *)in_stack_fffffffffffffc80,
             in_stack_fffffffffffffda0);
  std::function<UniValue_(const_RPCHelpMan_&,_const_JSONRPCRequest_&)>::~function
            ((function<UniValue_(const_RPCHelpMan_&,_const_JSONRPCRequest_&)> *)this);
  RPCExamples::~RPCExamples((RPCExamples *)this);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_3a9);
  RPCResults::~RPCResults((RPCResults *)this);
  RPCResult::~RPCResult((RPCResult *)this);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_fffffffffffffb48);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_38a);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(local_389);
  std::vector<RPCArg,_std::allocator<RPCArg>_>::~vector
            ((vector<RPCArg,_std::allocator<RPCArg>_> *)in_stack_fffffffffffffb48);
  std::allocator<RPCArg>::~allocator((allocator<RPCArg> *)this);
  puVar2 = local_150;
  puVar1 = local_48;
  do {
    puVar1 = puVar1 + -0x108;
    RPCArg::~RPCArg(this);
  } while (puVar1 != puVar2);
  RPCArgOptions::~RPCArgOptions((RPCArgOptions *)this);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xfffffffffffffc97);
  std::
  variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  ::~variant((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)this);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xfffffffffffffc9f);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_342);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(local_341);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

static RPCHelpMan setnetworkactive()
{
    return RPCHelpMan{"setnetworkactive",
                "\nDisable/enable all p2p network activity.\n",
                {
                    {"state", RPCArg::Type::BOOL, RPCArg::Optional::NO, "true to enable networking, false to disable"},
                },
                RPCResult{RPCResult::Type::BOOL, "", "The value that was passed in"},
                RPCExamples{""},
        [&](const RPCHelpMan& self, const JSONRPCRequest& request) -> UniValue
{
    NodeContext& node = EnsureAnyNodeContext(request.context);
    CConnman& connman = EnsureConnman(node);

    connman.SetNetworkActive(request.params[0].get_bool());

    return connman.GetNetworkActive();
},
    };
}